

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_fits.c
# Opt level: O1

void sfts_delete_key(sfts_t *f,char *key)

{
  undefined8 uVar1;
  char _msg [31];
  
  if (key == (char *)0x0) {
    _p2sc_msg("sfts_delete_key",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libp2sc/p2sc_fits.c"
              ,0x1cb,"$Id: p2sc_fits.c 5204 2015-04-30 19:12:42Z bogdan $",0x12c0,"NULL keyword");
  }
  else {
    ffdkey(f->fts,key,&f->stat);
    if (f->stat == 0) {
      return;
    }
    if (f->name == (char *)0x0) {
      uVar1 = g_strdup("memory");
    }
    else {
      uVar1 = g_path_get_basename();
    }
    ffgerr(f->stat,_msg);
    _msg[0x1e] = '\0';
    _p2sc_msg("sfts_delete_key",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libp2sc/p2sc_fits.c"
              ,0x1cf,"$Id: p2sc_fits.c 5204 2015-04-30 19:12:42Z bogdan $",0x11f8,"FITS: %s: %s",
              _msg,uVar1);
  }
  exit(1);
}

Assistant:

void sfts_delete_key(sfts_t *f, const char *key) {
    if (!key) {
        P2SC_Msg(LVL_FATAL_INTERNAL_ERROR, "NULL keyword");
        return;
    }
    fits_delete_key(f->fts, key, &f->stat);
    CHK_FTS(f);
}